

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkComputeSupportsSmart(Abc_Ntk_t *pNtk)

{
  char *pcVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  int *piVar6;
  Supp_One_t *p1;
  void *pvVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  Supp_Man_t *p;
  Vec_Ptr_t *pVVar11;
  void **ppvVar12;
  Vec_Ptr_t *__ptr;
  Abc_Obj_t *pAVar13;
  Vec_Int_t *p_00;
  void **ppvVar14;
  long lVar15;
  Supp_One_t *p_01;
  
  lVar10 = (long)pNtk->vCis->nSize;
  if (0 < lVar10) {
    ppvVar12 = pNtk->vCis->pArray;
    lVar15 = 0;
    do {
      *(long *)((long)ppvVar12[lVar15] + 8) = lVar15;
      lVar15 = lVar15 + 1;
    } while (lVar10 != lVar15);
  }
  lVar10 = (long)pNtk->vCos->nSize;
  if (0 < lVar10) {
    ppvVar12 = pNtk->vCos->pArray;
    lVar15 = 0;
    do {
      *(long *)((long)ppvVar12[lVar15] + 8) = lVar15;
      lVar15 = lVar15 + 1;
    } while (lVar10 != lVar15);
  }
  p = Supp_ManStart(0x100000,0x40);
  iVar2 = pNtk->vCos->nSize;
  pVVar11 = (Vec_Ptr_t *)malloc(0x10);
  iVar9 = 8;
  if (6 < iVar2 - 1U) {
    iVar9 = iVar2;
  }
  pVVar11->nSize = 0;
  pVVar11->nCap = iVar9;
  if (iVar9 == 0) {
    ppvVar12 = (void **)0x0;
  }
  else {
    ppvVar12 = (void **)malloc((long)iVar9 << 3);
  }
  pVVar11->pArray = ppvVar12;
  Abc_NtkCleanCopy(pNtk);
  __ptr = Abc_NtkDfsNatural(pNtk);
  iVar2 = __ptr->nSize;
  if (0 < (long)iVar2) {
    ppvVar12 = __ptr->pArray;
    lVar10 = 0;
    do {
      pAVar5 = (Abc_Obj_t *)ppvVar12[lVar10];
      uVar8 = *(uint *)&pAVar5->field_0x14 & 0xf;
      if (uVar8 == 7) {
        piVar6 = (pAVar5->vFanins).pArray;
        ppvVar14 = pAVar5->pNtk->vObjs->pArray;
        p1 = *(Supp_One_t **)((long)ppvVar14[*piVar6] + 0x40);
        p_01 = *(Supp_One_t **)((long)ppvVar14[piVar6[1]] + 0x40);
        pAVar13 = (Abc_Obj_t *)Supp_ManMergeEntry(p,p1,p_01,(pAVar5->vFanouts).nSize);
        (pAVar5->field_6).pCopy = pAVar13;
        if (p1->nRefs < 1) {
          __assert_fail("pPart0->nRefs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPart.c"
                        ,0x15a,"Vec_Ptr_t *Abc_NtkComputeSupportsSmart(Abc_Ntk_t *)");
        }
        iVar9 = p1->nRefs + -1;
        p1->nRefs = iVar9;
        if (iVar9 == 0) {
          iVar9 = p1->nOutsAlloc;
          if (iVar9 < p1->nOuts) goto LAB_0027b5c4;
          if (p1->nOuts < iVar9 / 2) goto LAB_0027b5e3;
          Supp_ManRecycle(p,(char *)p1,iVar9 * 4 + 0xc);
        }
        iVar9 = p_01->nRefs;
        if (iVar9 < 1) {
          __assert_fail("pPart1->nRefs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPart.c"
                        ,0x15d,"Vec_Ptr_t *Abc_NtkComputeSupportsSmart(Abc_Ntk_t *)");
        }
LAB_0027b47c:
        p_01->nRefs = iVar9 + -1;
        if (iVar9 + -1 == 0) {
          iVar9 = p_01->nOutsAlloc;
          if (iVar9 < p_01->nOuts) {
LAB_0027b5c4:
            __assert_fail("pEntry->nOuts <= pEntry->nOutsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPart.c"
                          ,0xc4,"void Supp_ManRecycleEntry(Supp_Man_t *, Supp_One_t *)");
          }
          if (p_01->nOuts < iVar9 / 2) {
LAB_0027b5e3:
            __assert_fail("pEntry->nOuts >= pEntry->nOutsAlloc/2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPart.c"
                          ,0xc5,"void Supp_ManRecycleEntry(Supp_Man_t *, Supp_One_t *)");
          }
          Supp_ManRecycle(p,(char *)p_01,iVar9 * 4 + 0xc);
        }
      }
      else {
        if (0xfffffffd < uVar8 - 5) {
          pvVar7 = pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
          p_01 = *(Supp_One_t **)((long)pvVar7 + 0x40);
          if ((*(uint *)((long)pvVar7 + 0x14) & 0xf) == 7) {
            p_00 = Supp_ManTransferEntry(p_01);
            Vec_IntPush(p_00,*(int *)&pAVar5->pNext);
            uVar8 = pVVar11->nSize;
            uVar4 = pVVar11->nCap;
            if (uVar8 == uVar4) {
              if ((int)uVar4 < 0x10) {
                if (pVVar11->pArray == (void **)0x0) {
                  ppvVar14 = (void **)malloc(0x80);
                }
                else {
                  ppvVar14 = (void **)realloc(pVVar11->pArray,0x80);
                }
                iVar9 = 0x10;
              }
              else {
                iVar9 = uVar4 * 2;
                if (iVar9 <= (int)uVar4) goto LAB_0027b461;
                if (pVVar11->pArray == (void **)0x0) {
                  ppvVar14 = (void **)malloc((ulong)uVar4 << 4);
                }
                else {
                  ppvVar14 = (void **)realloc(pVVar11->pArray,(ulong)uVar4 << 4);
                }
              }
              pVVar11->pArray = ppvVar14;
              pVVar11->nCap = iVar9;
            }
LAB_0027b461:
            pVVar11->nSize = uVar8 + 1;
            pVVar11->pArray[(int)uVar8] = p_00;
          }
          iVar9 = p_01->nRefs;
          if (iVar9 < 1) {
            __assert_fail("pPart0->nRefs > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPart.c"
                          ,0x16c,"Vec_Ptr_t *Abc_NtkComputeSupportsSmart(Abc_Ntk_t *)");
          }
          goto LAB_0027b47c;
        }
        if ((uVar8 == 5) || (uVar8 == 2)) {
          iVar9 = (pAVar5->vFanouts).nSize;
          if (iVar9 != 0) {
            pAVar13 = (Abc_Obj_t *)Supp_ManFetch(p,0x10);
            *(int *)&pAVar13->pNtk = iVar9;
            pcVar1 = (char *)((long)&pAVar13->pNtk + 4);
            pcVar1[0] = '\0';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            pcVar1[4] = '\x01';
            pcVar1[5] = '\0';
            pcVar1[6] = '\0';
            pcVar1[7] = '\0';
            uVar3 = *(undefined4 *)&pAVar5->pNext;
            pcVar1 = (char *)((long)&pAVar13->pNtk + 4);
            pcVar1[0] = '\x01';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            *(undefined4 *)((long)&pAVar13->pNext + 4) = uVar3;
            goto LAB_0027b41a;
          }
        }
        else {
          pAVar13 = Abc_AigConst1(pNtk);
          if (pAVar5 != pAVar13) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPart.c"
                          ,0x181,"Vec_Ptr_t *Abc_NtkComputeSupportsSmart(Abc_Ntk_t *)");
          }
          iVar9 = (pAVar5->vFanouts).nSize;
          if (iVar9 != 0) {
            pAVar13 = (Abc_Obj_t *)Supp_ManFetch(p,0xc);
            *(int *)&pAVar13->pNtk = iVar9;
            *(undefined8 *)((long)&pAVar13->pNtk + 4) = 0;
LAB_0027b41a:
            (pAVar5->field_6).pCopy = pAVar13;
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (iVar2 != lVar10);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  Supp_ManStop(p);
  qsort(pVVar11->pArray,(long)pVVar11->nSize,8,Vec_VecSortCompare2);
  lVar10 = (long)pNtk->vCis->nSize;
  if (0 < lVar10) {
    ppvVar12 = pNtk->vCis->pArray;
    lVar15 = 0;
    do {
      *(undefined8 *)((long)ppvVar12[lVar15] + 8) = 0;
      lVar15 = lVar15 + 1;
    } while (lVar10 != lVar15);
  }
  lVar10 = (long)pNtk->vCos->nSize;
  if (0 < lVar10) {
    ppvVar12 = pNtk->vCos->pArray;
    lVar15 = 0;
    do {
      *(undefined8 *)((long)ppvVar12[lVar15] + 8) = 0;
      lVar15 = lVar15 + 1;
    } while (lVar10 != lVar15);
  }
  return pVVar11;
}

Assistant:

Vec_Ptr_t * Abc_NtkComputeSupportsSmart( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSupports;
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vSupp;
    Supp_Man_t * p;
    Supp_One_t * pPart0, * pPart1;
    Abc_Obj_t * pObj;
    int i;
    // set the number of PIs/POs
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)i;
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)i;
    // start the support computation manager
    p = Supp_ManStart( 1 << 20, 1 << 6 );
    // consider objects in the topological order
    vSupports = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkCleanCopy(pNtk);
    // order the nodes so that the PIs and POs follow naturally
    vNodes = Abc_NtkDfsNatural( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        if ( Abc_ObjIsNode(pObj) )
        {
            pPart0 = (Supp_One_t *)Abc_ObjFanin0(pObj)->pCopy;
            pPart1 = (Supp_One_t *)Abc_ObjFanin1(pObj)->pCopy;
            pObj->pCopy = (Abc_Obj_t *)Supp_ManMergeEntry( p, pPart0, pPart1, Abc_ObjFanoutNum(pObj) );
            assert( pPart0->nRefs > 0 );
            if ( --pPart0->nRefs == 0 )
                Supp_ManRecycleEntry( p, pPart0 );
            assert( pPart1->nRefs > 0 );
            if ( --pPart1->nRefs == 0 )
                Supp_ManRecycleEntry( p, pPart1 );
            continue;
        }
        if ( Abc_ObjIsCo(pObj) )
        {
            pPart0 = (Supp_One_t *)Abc_ObjFanin0(pObj)->pCopy;
            // only save the CO if it is non-trivial
            if ( Abc_ObjIsNode(Abc_ObjFanin0(pObj)) )
            {
                vSupp = Supp_ManTransferEntry(pPart0);
                Vec_IntPush( vSupp, (int)(ABC_PTRINT_T)pObj->pNext );
                Vec_PtrPush( vSupports, vSupp );
            }
            assert( pPart0->nRefs > 0 );
            if ( --pPart0->nRefs == 0 )
                Supp_ManRecycleEntry( p, pPart0 );
            continue;
        }
        if ( Abc_ObjIsCi(pObj) )
        {
            if ( Abc_ObjFanoutNum(pObj) )
            {
                pPart0 = (Supp_One_t *)Supp_ManFetchEntry( p, 1, Abc_ObjFanoutNum(pObj) );
                pPart0->pOuts[ pPart0->nOuts++ ] = (int)(ABC_PTRINT_T)pObj->pNext;
                pObj->pCopy = (Abc_Obj_t *)pPart0;
            }
            continue;
        }
        if ( pObj == Abc_AigConst1(pNtk) )
        {
            if ( Abc_ObjFanoutNum(pObj) )
                pObj->pCopy = (Abc_Obj_t *)Supp_ManFetchEntry( p, 0, Abc_ObjFanoutNum(pObj) );
            continue;
        }
        assert( 0 );
    }
    Vec_PtrFree( vNodes );
//printf( "Memory usage = %d MB.\n", Vec_PtrSize(p->vMemory) * p->nChunkSize / (1<<20) );
    Supp_ManStop( p );
    // sort supports by size
    Vec_VecSort( (Vec_Vec_t *)vSupports, 1 );
    // clear the number of PIs/POs
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = NULL;
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->pNext = NULL;
/*
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vSupp, i )
        printf( "%d ", Vec_IntSize(vSupp) );
    printf( "\n" );
*/
    return vSupports;
}